

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void __thiscall
RPCArg::RPCArg(RPCArg *this,string name,Type type,Fallback fallback,string description,
              vector<RPCArg,_std::allocator<RPCArg>_> inner,RPCArgOptions *opts)

{
  size_type *psVar1;
  long lVar2;
  pointer pRVar3;
  undefined8 uVar4;
  pointer pbVar5;
  char cVar6;
  _Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_RCX;
  Type TVar7;
  undefined4 in_register_00000034;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  bool local_39;
  long local_38;
  
  plVar8 = (long *)CONCAT44(in_register_00000034,type);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar9 = &(this->m_names).field_2;
  (this->m_names)._M_dataplus._M_p = (pointer)paVar9;
  psVar1 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar1) {
    lVar2 = plVar8[3];
    paVar9->_M_allocated_capacity = *psVar1;
    *(long *)((long)&(this->m_names).field_2 + 8) = lVar2;
  }
  else {
    (this->m_names)._M_dataplus._M_p = (pointer)*plVar8;
    (this->m_names).field_2._M_allocated_capacity = *psVar1;
  }
  (this->m_names)._M_string_length = plVar8[1];
  *plVar8 = (long)psVar1;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  TVar7 = (Type)opts;
  this->m_type = TVar7;
  pRVar3 = (pointer)in_R9[1];
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*in_R9;
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar3;
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_R9[2];
  in_R9[2] = 0;
  *in_R9 = 0;
  in_R9[1] = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::_Move_ctor_base((_Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                     *)&this->m_fallback,in_RCX);
  paVar9 = &(this->m_description).field_2;
  (this->m_description)._M_dataplus._M_p = (pointer)paVar9;
  psVar1 = (size_type *)(in_R8 + 2);
  if ((size_type *)*in_R8 == psVar1) {
    lVar2 = in_R8[3];
    paVar9->_M_allocated_capacity = *psVar1;
    *(long *)((long)&(this->m_description).field_2 + 8) = lVar2;
  }
  else {
    (this->m_description)._M_dataplus._M_p = (pointer)*in_R8;
    (this->m_description).field_2._M_allocated_capacity = *psVar1;
  }
  (this->m_description)._M_string_length = in_R8[1];
  *in_R8 = (long)psVar1;
  in_R8[1] = 0;
  *(undefined1 *)(in_R8 + 2) = 0;
  (this->m_opts).skip_type_check = (bool)*name._M_dataplus._M_p;
  paVar9 = &(this->m_opts).oneline_description.field_2;
  (this->m_opts).oneline_description._M_dataplus._M_p = (pointer)paVar9;
  psVar1 = (size_type *)(name._M_dataplus._M_p + 0x18);
  if (*(size_type **)(name._M_dataplus._M_p + 8) == psVar1) {
    uVar4 = *(undefined8 *)(name._M_dataplus._M_p + 0x20);
    paVar9->_M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&(this->m_opts).oneline_description.field_2 + 8) = uVar4;
  }
  else {
    (this->m_opts).oneline_description._M_dataplus._M_p =
         (pointer)*(size_type **)(name._M_dataplus._M_p + 8);
    (this->m_opts).oneline_description.field_2._M_allocated_capacity = *psVar1;
  }
  (this->m_opts).oneline_description._M_string_length = *(size_type *)(name._M_dataplus._M_p + 0x10)
  ;
  *(size_type **)(name._M_dataplus._M_p + 8) = psVar1;
  name._M_dataplus._M_p[0x10] = '\0';
  name._M_dataplus._M_p[0x11] = '\0';
  name._M_dataplus._M_p[0x12] = '\0';
  name._M_dataplus._M_p[0x13] = '\0';
  name._M_dataplus._M_p[0x14] = '\0';
  name._M_dataplus._M_p[0x15] = '\0';
  name._M_dataplus._M_p[0x16] = '\0';
  name._M_dataplus._M_p[0x17] = '\0';
  name._M_dataplus._M_p[0x18] = '\0';
  pbVar5 = *(pointer *)(name._M_dataplus._M_p + 0x30);
  (this->m_opts).type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(name._M_dataplus._M_p + 0x28);
  (this->m_opts).type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->m_opts).type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(name._M_dataplus._M_p + 0x38);
  name._M_dataplus._M_p[0x38] = '\0';
  name._M_dataplus._M_p[0x39] = '\0';
  name._M_dataplus._M_p[0x3a] = '\0';
  name._M_dataplus._M_p[0x3b] = '\0';
  name._M_dataplus._M_p[0x3c] = '\0';
  name._M_dataplus._M_p[0x3d] = '\0';
  name._M_dataplus._M_p[0x3e] = '\0';
  name._M_dataplus._M_p[0x3f] = '\0';
  name._M_dataplus._M_p[0x28] = '\0';
  name._M_dataplus._M_p[0x29] = '\0';
  name._M_dataplus._M_p[0x2a] = '\0';
  name._M_dataplus._M_p[0x2b] = '\0';
  name._M_dataplus._M_p[0x2c] = '\0';
  name._M_dataplus._M_p[0x2d] = '\0';
  name._M_dataplus._M_p[0x2e] = '\0';
  name._M_dataplus._M_p[0x2f] = '\0';
  name._M_dataplus._M_p[0x30] = '\0';
  name._M_dataplus._M_p[0x31] = '\0';
  name._M_dataplus._M_p[0x32] = '\0';
  name._M_dataplus._M_p[0x33] = '\0';
  name._M_dataplus._M_p[0x34] = '\0';
  name._M_dataplus._M_p[0x35] = '\0';
  name._M_dataplus._M_p[0x36] = '\0';
  name._M_dataplus._M_p[0x37] = '\0';
  cVar6 = name._M_dataplus._M_p[0x41];
  (this->m_opts).hidden = (bool)name._M_dataplus._M_p[0x40];
  (this->m_opts).also_positional = (bool)cVar6;
  if ((OBJ_NAMED_PARAMS < TVar7) || (local_39 = true, (0x23U >> (TVar7 & 0x1f) & 1) == 0)) {
    local_39 = TVar7 == OBJ_USER_KEYS;
  }
  inline_check_non_fatal<bool>
            (&local_39,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.h"
             ,0xf7,"RPCArg",
             "type == Type::ARR || type == Type::OBJ || type == Type::OBJ_NAMED_PARAMS || type == Type::OBJ_USER_KEYS"
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCArg(
        std::string name,
        Type type,
        Fallback fallback,
        std::string description,
        std::vector<RPCArg> inner,
        RPCArgOptions opts = {})
        : m_names{std::move(name)},
          m_type{std::move(type)},
          m_inner{std::move(inner)},
          m_fallback{std::move(fallback)},
          m_description{std::move(description)},
          m_opts{std::move(opts)}
    {
        CHECK_NONFATAL(type == Type::ARR || type == Type::OBJ || type == Type::OBJ_NAMED_PARAMS || type == Type::OBJ_USER_KEYS);
    }